

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chariter.cpp
# Opt level: O0

CharacterIterator * __thiscall
icu_63::CharacterIterator::operator=(CharacterIterator *this,CharacterIterator *that)

{
  CharacterIterator *that_local;
  CharacterIterator *this_local;
  
  ForwardCharacterIterator::operator=
            (&this->super_ForwardCharacterIterator,&that->super_ForwardCharacterIterator);
  this->textLength = that->textLength;
  this->pos = that->pos;
  this->begin = that->begin;
  this->end = that->end;
  return this;
}

Assistant:

CharacterIterator &
CharacterIterator::operator=(const CharacterIterator &that) {
    ForwardCharacterIterator::operator=(that);
    textLength = that.textLength;
    pos = that.pos;
    begin = that.begin;
    end = that.end;
    return *this;
}